

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

string * __thiscall FileWriter::buildFilename_abi_cxx11_(FileWriter *this,time_t t)

{
  ulong uVar1;
  char *pcVar2;
  size_type __maxsize;
  vector<char,_std::allocator<char>_> *pvVar3;
  tm *__tp;
  string *in_RDI;
  size_t len;
  vector<char,_std::allocator<char>_> tsbuf;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator local_51;
  ulong local_50;
  allocator<char> local_31;
  vector<char,_std::allocator<char>_> local_30;
  time_t local_18 [3];
  
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<char>::~allocator(&local_31);
  pvVar3 = &local_30;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x120ca3);
  __maxsize = std::vector<char,_std::allocator<char>_>::size(pvVar3);
  pvVar3 = (vector<char,_std::allocator<char>_> *)std::__cxx11::string::c_str();
  __tp = gmtime(local_18);
  local_50 = strftime(pcVar2,__maxsize,(char *)pvVar3,__tp);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x120cfd);
  uVar1 = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar2,uVar1,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar3);
  return in_RDI;
}

Assistant:

std::string FileWriter::buildFilename(time_t t) {
  std::vector<char> tsbuf(256);
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    pattern_.c_str(),
    gmtime(&t));
  return std::string(tsbuf.data(), len);
}